

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImTriangulator::Init(ImTriangulator *this,ImVec2 *points,int points_count,void *scratch_buffer)

{
  ImTriangulatorNode **ppIVar1;
  int iVar2;
  
  iVar2 = 0;
  if (2 < points_count) {
    iVar2 = points_count + -2;
  }
  this->_TrianglesLeft = iVar2;
  this->_Nodes = (ImTriangulatorNode *)scratch_buffer;
  ppIVar1 = (ImTriangulatorNode **)((long)points_count * 0x20 + (long)scratch_buffer);
  (this->_Ears).Data = ppIVar1;
  (this->_Reflexes).Data = ppIVar1 + points_count;
  BuildNodes(this,points,points_count);
  BuildReflexes(this);
  BuildEars(this);
  return;
}

Assistant:

void ImTriangulator::Init(const ImVec2* points, int points_count, void* scratch_buffer)
{
    IM_ASSERT(scratch_buffer != NULL && points_count >= 3);
    _TrianglesLeft = EstimateTriangleCount(points_count);
    _Nodes         = (ImTriangulatorNode*)scratch_buffer;                          // points_count x Node
    _Ears.Data     = (ImTriangulatorNode**)(_Nodes + points_count);                // points_count x Node*
    _Reflexes.Data = (ImTriangulatorNode**)(_Nodes + points_count) + points_count; // points_count x Node*
    BuildNodes(points, points_count);
    BuildReflexes();
    BuildEars();
}